

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::ChildPopper::visitArrayInitData
          (Result<wasm::Ok> *__return_storage_ptr__,ChildPopper *this,ArrayInitData *curr,
          optional<wasm::HeapType> ht)

{
  optional<wasm::HeapType> ht_00;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> local_58;
  IRBuilder *local_48;
  undefined1 *local_40;
  undefined1 auStack_38 [8];
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  children;
  
  local_40 = auStack_38;
  children.
  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_38 = (undefined1  [8])0x0;
  children.
  super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48 = this->builder;
  local_58.wasm = local_48->wasm;
  local_58.func = local_48->func;
  ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._8_8_ & 0xffffffff;
  ht_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayInitData
            (&local_58,curr,ht_00);
  popConstrainedChildren
            (__return_storage_ptr__,this,
             (vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
              *)auStack_38);
  std::
  _Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  ::~_Vector_base((_Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
                   *)auStack_38);
  return __return_storage_ptr__;
}

Assistant:

Result<> visitArrayInitData(ArrayInitData* curr,
                              std::optional<HeapType> ht = std::nullopt) {
    std::vector<Child> children;
    ConstraintCollector{builder, children}.visitArrayInitData(curr, ht);
    return popConstrainedChildren(children);
  }